

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O2

void __thiscall myutils::IpcConnection::do_recv(IpcConnection *this)

{
  Connection_Callback *pCVar1;
  int iVar2;
  int in_ECX;
  int iVar3;
  bool bVar4;
  size_t size;
  char *data;
  
  if (this->m_recv_queue != (ShmemQueue *)0x0) {
    iVar3 = 10;
    while ((bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4 &&
           (iVar2 = ShmemQueue::poll(this->m_recv_queue,(pollfd *)&data,(nfds_t)&size,in_ECX),
           (char)iVar2 != '\0'))) {
      pCVar1 = this->m_callback;
      if (pCVar1 != (Connection_Callback *)0x0) {
        (**pCVar1->_vptr_Connection_Callback)(pCVar1,data,size);
      }
      ShmemQueue::pop(this->m_recv_queue);
    }
  }
  return;
}

Assistant:

void IpcConnection::do_recv()
{
    if (!m_recv_queue) return;

    const char* data;
    size_t size;

    // at most read 10 msgs in one loop
    for (int i = 0; i < 10; i++) {
        if (m_recv_queue->poll(&data, &size) ) {
            if (m_callback)
                m_callback->on_recv(data, size);
            m_recv_queue->pop();
        }
        else {
            break;
        }
    }
}